

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData *
cfd::core::ConfidentialValue::ConvertToConfidentialValue
          (ByteData *__return_storage_ptr__,Amount *value)

{
  uint64_t satoshi;
  CfdException *this;
  allocator local_55;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined1 local_38 [32];
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer,9,
             (allocator_type *)local_38);
  satoshi = Amount::GetSatoshiValue(value);
  ret = wally_tx_confidential_value_from_satoshi
                  (satoshi,buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                   (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData(__return_storage_ptr__,&buffer);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_38._0_8_ = "cfdcore_elements_transaction.cpp";
  local_38._8_4_ = 0x287;
  local_38._16_8_ = "ConvertToConfidentialValue";
  logger::warn<int&>((CfdSourceLocation *)local_38,
                     "wally_tx_confidential_value_from_satoshi NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"generate confidential value error.",&local_55);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData ConfidentialValue::ConvertToConfidentialValue(  // force LF
    const Amount &value) {
  std::vector<uint8_t> buffer(kConfidentialValueSize);
  uint64_t satoshi = static_cast<uint64_t>(value.GetSatoshiValue());
  int ret = wally_tx_confidential_value_from_satoshi(
      satoshi, buffer.data(), buffer.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_confidential_value_from_satoshi NG[{}].",
        ret);
    throw CfdException(
        kCfdIllegalStateError, "generate confidential value error.");
  }
  return ByteData(buffer);
}